

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomx.cpp
# Opt level: O2

randomx_cache * randomx_alloc_cache(randomx_flags flags)

{
  Instruction IVar1;
  randomx_cache *cache;
  JitCompilerX86 *pJVar2;
  code *pcVar3;
  uint8_t *puVar4;
  randomx_cache *this;
  size_type sVar5;
  char cVar6;
  size_t __n;
  long unaff_RBP;
  size_t size;
  randomx_cache *this_00;
  ulong uVar7;
  
  IVar1 = (Instruction)randomx::selectArgonImpl(flags);
  if (IVar1 == (Instruction)0x0) goto LAB_0011100c;
  cache = (randomx_cache *)operator_new(0x83a8);
  this = (randomx_cache *)&(cache->cacheKey).field_2;
  size = 0;
  this_00 = cache;
  memset(cache,0,0x83a0);
  (cache->cacheKey)._M_dataplus._M_p = (pointer)this;
  (cache->cacheKey).field_2._M_local_buf[0] = '\0';
  cache->argonImpl = (randomx_argon2_impl *)IVar1;
  uVar7 = (ulong)(flags & (RANDOMX_FLAG_JIT|RANDOMX_FLAG_LARGE_PAGES));
  cVar6 = (char)((long)&switchD_00110f21::switchdataD_0011fa40 +
                (long)(int)(&switchD_00110f21::switchdataD_0011fa40)[uVar7]);
  switch(flags & (RANDOMX_FLAG_JIT|RANDOMX_FLAG_LARGE_PAGES)) {
  case RANDOMX_FLAG_DEFAULT:
    cache->dealloc = randomx::deallocCache<randomx::AlignedAllocator<64ul>>;
    cache->jit = (JitCompiler *)0x0;
    cache->initialize = randomx::initCache;
    pcVar3 = randomx::initDataset;
    goto LAB_00110feb;
  case RANDOMX_FLAG_LARGE_PAGES:
    cache->dealloc = randomx::deallocCache<randomx::LargePageAllocator>;
    cache->jit = (JitCompiler *)0x0;
    cache->initialize = randomx::initCache;
    pcVar3 = randomx::initDataset;
    goto LAB_00110fa3;
  default:
    operator_delete(this);
    if ((int)__n != 1) {
      _Unwind_Resume(&switchD_00110f21::switchdataD_0011fa40);
    }
    __cxa_begin_catch(&switchD_00110f21::switchdataD_0011fa40);
    if (cache != (randomx_cache *)0x0) {
      randomx_release_cache(cache);
    }
    __cxa_end_catch();
    goto LAB_0011100c;
  case RANDOMX_FLAG_JIT:
    cache->dealloc = randomx::deallocCache<randomx::AlignedAllocator<64ul>>;
    pJVar2 = (JitCompilerX86 *)operator_new(0x48);
    randomx::JitCompilerX86::JitCompilerX86(pJVar2);
    cache->jit = pJVar2;
    cache->initialize = randomx::initCacheCompile;
    pcVar3 = (code *)pJVar2->code;
LAB_00110feb:
    cache->datasetInit = pcVar3;
    puVar4 = (uint8_t *)randomx::AlignedAllocator<64UL>::allocMemory(0x10000000);
LAB_00110ffc:
    cache->memory = puVar4;
    if (puVar4 == (uint8_t *)0x0) {
      randomx_release_cache(cache);
LAB_0011100c:
      cache = (randomx_cache *)0x0;
    }
    return cache;
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_LARGE_PAGES:
    cache->dealloc = randomx::deallocCache<randomx::LargePageAllocator>;
    pJVar2 = (JitCompilerX86 *)operator_new(0x48);
    randomx::JitCompilerX86::JitCompilerX86(pJVar2);
    cache->jit = pJVar2;
    cache->initialize = randomx::initCacheCompile;
    pcVar3 = (code *)pJVar2->code;
LAB_00110fa3:
    cache->datasetInit = pcVar3;
    puVar4 = (uint8_t *)randomx::LargePageAllocator::allocMemory(0x10000000);
    goto LAB_00110ffc;
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_HARD_AES:
    if ((ulong)((long)&switchD_00110f21::switchdataD_0011fa40 +
               (long)(int)(&switchD_00110f21::switchdataD_0011fa40)[uVar7]) < 2) {
      return (randomx_cache *)(ulong)*(uint *)&this_00->memory;
    }
    memset(this_00,0,__n);
    cache[1].programs[0].programBuffer[0x179] = IVar1;
    cache[1].programs[0].programBuffer[0x17b].opcode = '\0';
    *(undefined ***)this = &PTR__VmBase_00126fd8;
    break;
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_HARD_AES|RANDOMX_FLAG_LARGE_PAGES:
    lutDec3[0xe2]._1_1_ = cVar6 + '\x14';
    halt_baddata();
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_FULL_MEM:
    this = (randomx_cache *)
           randomx::CompiledLightVm<randomx::LargePageAllocator,true,false>::operator_new
                     ((CompiledLightVm<randomx::LargePageAllocator,true,false> *)this_00,size);
    memset(this,0,0xcc0);
    randomx::CompiledLightVm<randomx::LargePageAllocator,_true,_false>::CompiledLightVm
              ((CompiledLightVm<randomx::LargePageAllocator,_true,_false> *)this);
    break;
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_FULL_MEM|RANDOMX_FLAG_LARGE_PAGES:
    *(char *)(unaff_RBP + 0x31) = *(char *)(unaff_RBP + 0x31) + '@';
    lutDec3._1014_4_ = 0x5c6cd571;
    halt_baddata();
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_FULL_MEM|RANDOMX_FLAG_HARD_AES:
    this = (randomx_cache *)
           randomx::CompiledLightVm<randomx::LargePageAllocator,false,false>::operator_new
                     ((CompiledLightVm<randomx::LargePageAllocator,false,false> *)this_00,size);
    memset(this,0,0xcc0);
    randomx::CompiledLightVm<randomx::LargePageAllocator,_false,_false>::CompiledLightVm
              ((CompiledLightVm<randomx::LargePageAllocator,_false,_false> *)this);
    break;
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_FULL_MEM|RANDOMX_FLAG_HARD_AES|RANDOMX_FLAG_LARGE_PAGES:
    lutDec3[0xe2]._1_1_ = cVar6 + '\x14';
    halt_baddata();
  }
  sVar5 = ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)&this->memory)->_M_allocated_capacity;
  if (uVar7 != 0) {
    (**(code **)(sVar5 + 0x30))(this,uVar7);
    std::__cxx11::string::_M_assign((string *)(this->programs[0].programBuffer + 0x17c));
    sVar5 = ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)&this->memory)->_M_allocated_capacity;
  }
  if (cache != (randomx_cache *)0x0) {
    (**(code **)(sVar5 + 0x28))(this,cache);
    sVar5 = ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)&this->memory)->_M_allocated_capacity;
  }
  (**(code **)(sVar5 + 0x10))(this);
  return this;
}

Assistant:

randomx_cache *randomx_alloc_cache(randomx_flags flags) {
		randomx_cache *cache = nullptr;
		auto impl = randomx::selectArgonImpl(flags);
		if (impl == nullptr) {
			return cache;
		}

		try {
			cache = new randomx_cache();
			cache->argonImpl = impl;
			switch ((int)(flags & (RANDOMX_FLAG_JIT | RANDOMX_FLAG_LARGE_PAGES))) {
				case RANDOMX_FLAG_DEFAULT:
					cache->dealloc = &randomx::deallocCache<randomx::DefaultAllocator>;
					cache->jit = nullptr;
					cache->initialize = &randomx::initCache;
					cache->datasetInit = &randomx::initDataset;
					cache->memory = (uint8_t*)randomx::DefaultAllocator::allocMemory(randomx::CacheSize);
					break;

				case RANDOMX_FLAG_JIT:
					cache->dealloc = &randomx::deallocCache<randomx::DefaultAllocator>;
					cache->jit = new randomx::JitCompiler();
					cache->initialize = &randomx::initCacheCompile;
					cache->datasetInit = cache->jit->getDatasetInitFunc();
					cache->memory = (uint8_t*)randomx::DefaultAllocator::allocMemory(randomx::CacheSize);
					break;

				case RANDOMX_FLAG_LARGE_PAGES:
					cache->dealloc = &randomx::deallocCache<randomx::LargePageAllocator>;
					cache->jit = nullptr;
					cache->initialize = &randomx::initCache;
					cache->datasetInit = &randomx::initDataset;
					cache->memory = (uint8_t*)randomx::LargePageAllocator::allocMemory(randomx::CacheSize);
					break;

				case RANDOMX_FLAG_JIT | RANDOMX_FLAG_LARGE_PAGES:
					cache->dealloc = &randomx::deallocCache<randomx::LargePageAllocator>;
					cache->jit = new randomx::JitCompiler();
					cache->initialize = &randomx::initCacheCompile;
					cache->datasetInit = cache->jit->getDatasetInitFunc();
					cache->memory = (uint8_t*)randomx::LargePageAllocator::allocMemory(randomx::CacheSize);
					break;

				default:
					UNREACHABLE;
			}
		}
		catch (std::exception &ex) {
			if (cache != nullptr) {
				randomx_release_cache(cache);
				cache = nullptr;
			}
		}
		if (cache && cache->memory == nullptr) {
			randomx_release_cache(cache);
			cache = nullptr;
		}

		return cache;
	}